

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

bool asmjit::_abi_1_10::a64::pickFpOpcode
               (Vec *reg,uint32_t sOp,uint32_t sHf,uint32_t vOp,uint32_t vHf,Opcode *opcode,
               uint32_t *szOut)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)((ulong)reg >> 3) & 0x1f;
  if (((ulong)reg & 0x7000) == 0) {
    uVar2 = uVar1 - 9;
    if (2 < uVar2) {
      return false;
    }
    if ((pickFpOpcode::szBits[sHf].sizeMask >> (uVar2 & 0x1f) & 1) == 0) {
      return false;
    }
    uVar1 = *(uint *)((ulong)sHf * 0x10 + 0x14e204 + (ulong)uVar2 * 4) ^ sOp;
    vOp = sOp;
  }
  else {
    uVar1 = uVar1 - 0xb;
    uVar2 = ((uint)reg >> 0xc & 7) - 2;
    if ((2 < uVar2 || 1 < uVar1) ||
       ((pickFpOpcode::szBits[vHf].sizeMask >> (uVar2 & 0x1f) & 1) == 0)) {
      return false;
    }
    uVar1 = (uVar1 * 0x40000000 | vOp) ^ *(uint *)((ulong)vHf * 0x10 + 0x14e204 + (ulong)uVar2 * 4);
  }
  opcode->v = uVar1;
  *szOut = uVar2;
  return vOp != 0;
}

Assistant:

inline constexpr RegType regType() const noexcept { return (RegType)getField<kRegTypeMask>(); }